

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlDtdPtr xmlCtxtParseDtd(xmlParserCtxtPtr ctxt,xmlParserInputPtr input,xmlChar *publicId,
                         xmlChar *systemId)

{
  int iVar1;
  xmlDocPtr pxVar2;
  xmlDtdPtr pxVar3;
  xmlParserInputPtr input_00;
  _xmlNode *local_40;
  xmlNodePtr tmp;
  xmlDtdPtr ret;
  xmlChar *systemId_local;
  xmlChar *publicId_local;
  xmlParserInputPtr input_local;
  xmlParserCtxtPtr ctxt_local;
  
  tmp = (xmlNodePtr)0x0;
  if ((ctxt == (xmlParserCtxtPtr)0x0) || (input == (xmlParserInputPtr)0x0)) {
    xmlFatalErr(ctxt,XML_ERR_ARGUMENT,(char *)0x0);
    xmlFreeInputStream(input);
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    iVar1 = xmlCtxtPushInput(ctxt,input);
    if (iVar1 < 0) {
      xmlFreeInputStream(input);
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else {
      systemId_local = publicId;
      if (publicId == (xmlChar *)0x0) {
        systemId_local = "none";
      }
      ret = (xmlDtdPtr)systemId;
      if (systemId == (xmlChar *)0x0) {
        ret = (xmlDtdPtr)anon_var_dwarf_f6da;
      }
      pxVar2 = xmlNewDoc("1.0");
      ctxt->myDoc = pxVar2;
      if (ctxt->myDoc == (xmlDocPtr)0x0) {
        xmlErrMemory(ctxt);
      }
      else {
        ctxt->myDoc->properties = 0x40;
        pxVar3 = xmlNewDtd(ctxt->myDoc,(xmlChar *)"none",systemId_local,(xmlChar *)ret);
        ctxt->myDoc->extSubset = pxVar3;
        if (ctxt->myDoc->extSubset == (_xmlDtd *)0x0) {
          xmlErrMemory(ctxt);
          xmlFreeDoc(ctxt->myDoc);
        }
        else {
          xmlParseExternalSubset(ctxt,systemId_local,(xmlChar *)ret);
          if (ctxt->wellFormed == 0) {
            tmp = (xmlNodePtr)0x0;
          }
          else {
            tmp = (xmlNodePtr)ctxt->myDoc->extSubset;
            ctxt->myDoc->extSubset = (_xmlDtd *)0x0;
            if ((_xmlDtd *)tmp != (_xmlDtd *)0x0) {
              ((_xmlDtd *)tmp)->doc = (_xmlDoc *)0x0;
              for (local_40 = ((_xmlDtd *)tmp)->children; local_40 != (_xmlNode *)0x0;
                  local_40 = local_40->next) {
                local_40->doc = (_xmlDoc *)0x0;
              }
            }
          }
          xmlFreeDoc(ctxt->myDoc);
          ctxt->myDoc = (xmlDocPtr)0x0;
        }
      }
      input_00 = xmlCtxtPopInput(ctxt);
      xmlFreeInputStream(input_00);
      ctxt_local = (xmlParserCtxtPtr)tmp;
    }
  }
  return (xmlDtdPtr)ctxt_local;
}

Assistant:

xmlDtdPtr
xmlCtxtParseDtd(xmlParserCtxtPtr ctxt, xmlParserInputPtr input,
                const xmlChar *publicId, const xmlChar *systemId) {
    xmlDtdPtr ret = NULL;

    if ((ctxt == NULL) || (input == NULL)) {
        xmlFatalErr(ctxt, XML_ERR_ARGUMENT, NULL);
        xmlFreeInputStream(input);
        return(NULL);
    }

    if (xmlCtxtPushInput(ctxt, input) < 0) {
        xmlFreeInputStream(input);
        return(NULL);
    }

    if (publicId == NULL)
        publicId = BAD_CAST "none";
    if (systemId == NULL)
        systemId = BAD_CAST "none";

    ctxt->myDoc = xmlNewDoc(BAD_CAST "1.0");
    if (ctxt->myDoc == NULL) {
        xmlErrMemory(ctxt);
        goto error;
    }
    ctxt->myDoc->properties = XML_DOC_INTERNAL;
    ctxt->myDoc->extSubset = xmlNewDtd(ctxt->myDoc, BAD_CAST "none",
                                       publicId, systemId);
    if (ctxt->myDoc->extSubset == NULL) {
        xmlErrMemory(ctxt);
        xmlFreeDoc(ctxt->myDoc);
        goto error;
    }

    xmlParseExternalSubset(ctxt, publicId, systemId);

    if (ctxt->wellFormed) {
        ret = ctxt->myDoc->extSubset;
        ctxt->myDoc->extSubset = NULL;
        if (ret != NULL) {
            xmlNodePtr tmp;

            ret->doc = NULL;
            tmp = ret->children;
            while (tmp != NULL) {
                tmp->doc = NULL;
                tmp = tmp->next;
            }
        }
    } else {
        ret = NULL;
    }
    xmlFreeDoc(ctxt->myDoc);
    ctxt->myDoc = NULL;

error:
    xmlFreeInputStream(xmlCtxtPopInput(ctxt));

    return(ret);
}